

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::EntryPointInfo::Finalize(EntryPointInfo *this,bool isShutdown)

{
  nullptr_t local_20;
  byte local_11;
  EntryPointInfo *pEStack_10;
  bool isShutdown_local;
  EntryPointInfo *this_local;
  
  local_11 = isShutdown;
  pEStack_10 = this;
  ExpirableObject::Finalize((ExpirableObject *)this,isShutdown);
  if ((local_11 & 1) == 0) {
    (*(this->super_ProxyEntryPointInfo).super_ExpirableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])();
  }
  SetCleanupReason(this,CleanUpForFinalize);
  Cleanup(this,(bool)(local_11 & 1),false);
  if (this->cleanupStack != (Type)0x0) {
    StackBackTrace::Delete<Memory::NoCheckHeapAllocator>
              (this->cleanupStack,(NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance);
    this->cleanupStack = (Type)0x0;
  }
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::operator=(&this->library,&local_20);
  return;
}

Assistant:

void EntryPointInfo::Finalize(bool isShutdown)
    {
        __super::Finalize(isShutdown);

        if (!isShutdown)
        {
            ReleasePendingWorkItem();
        }

#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
        this->SetCleanupReason(CleanupReason::CleanUpForFinalize);
#endif

        this->Cleanup(isShutdown, false);

#if ENABLE_ENTRYPOINT_CLEANUP_TRACE
#if ENABLE_DEBUG_STACK_BACK_TRACE
        if (this->cleanupStack != nullptr)
        {
            this->cleanupStack->Delete(&NoCheckHeapAllocator::Instance);
            this->cleanupStack = nullptr;
        }
#endif
#endif

        this->library = nullptr;
    }